

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

void __thiscall EmmyFacade::Destroy(EmmyFacade *this)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Transporter> local_20;
  EmmyFacade *local_10;
  EmmyFacade *this_local;
  
  local_10 = this;
  OnDisconnect(this);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->transporter);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Transporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Transporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->transporter);
    (*peVar2->_vptr_Transporter[2])();
    std::shared_ptr<Transporter>::shared_ptr(&local_20,(nullptr_t)0x0);
    std::shared_ptr<Transporter>::operator=(&this->transporter,&local_20);
    std::shared_ptr<Transporter>::~shared_ptr(&local_20);
  }
  return;
}

Assistant:

void EmmyFacade::Destroy() {
	OnDisconnect();

	if (transporter) {
		transporter->Stop();
		transporter = nullptr;
	}
}